

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O2

void device3(void *arg)

{
  int line;
  int iVar1;
  char *in_RCX;
  int sock;
  
  line = test_socket_impl((char *)0x58,2,0x70,(int)in_RCX);
  test_bind_impl((char *)0x59,line,0x102217,in_RCX);
  iVar1 = nn_device(line,0xffffffffffffffff);
  if (iVar1 < 0) {
    iVar1 = nn_errno();
    if (iVar1 == 0x9523dfd) {
      test_close_impl((char *)0x60,line,sock);
      return;
    }
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0 && nn_errno () == ETERM",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c",
          0x5d);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void device3 (NN_UNUSED void *arg)
{
    int rc;
    int deve;

    /*  Intialise the device socket. */
    deve = test_socket (AF_SP_RAW, NN_BUS);
    test_bind (deve, SOCKET_ADDRESS_E);

    /*  Run the device. */
    rc = nn_device (deve, -1);
    nn_assert (rc < 0 && nn_errno () == ETERM);

    /*  Clean up. */
    test_close (deve);
}